

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchSolve.cpp
# Opt level: O3

bool Bmatch_GetGuess(vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                     *f,vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                        *g,vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                           *fo,
                    vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                    *gi,PI_PO_INFO *pInformation,METHOD method)

{
  pointer __src;
  void *__src_00;
  undefined8 *puVar1;
  long *plVar2;
  int iVar3;
  suppWrap *psVar4;
  iterator __position;
  uint uVar5;
  pointer ppVar6;
  suppWrap *psVar7;
  pointer pvVar8;
  ulong uVar9;
  uint uVar10;
  pointer ppsVar11;
  void *pvVar12;
  byte bVar13;
  pointer *pppsVar14;
  int iVar15;
  ulong uVar16;
  pointer ppsVar17;
  long lVar18;
  suppWrap **b;
  bool bVar19;
  vector<suppWrap_*,_std::allocator<suppWrap_*>_> mapNodes;
  suppWrap *tmpWrap1;
  suppWrap *tmpW;
  vector<suppWrap_*,_std::allocator<suppWrap_*>_> local_f8;
  suppWrap *local_e0;
  PI_PO_INFO *local_d8;
  uint local_cc;
  value_type local_c8;
  suppWrap *local_a8;
  vector<suppWrap_*,_std::allocator<suppWrap_*>_> vStack_a0;
  uint local_7c;
  ulong local_78;
  vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
  *local_70;
  vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
  *local_68;
  vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
  *local_60;
  long local_58;
  long local_50;
  ulong local_48;
  vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
  *local_40;
  suppWrap *local_38;
  
  local_d8 = pInformation;
  local_40 = gi;
  if (((f->
       super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start ==
       (f->
       super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish) ||
     ((g->
      super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (g->
      super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    __assert_fail("!f.empty() && !g.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bmatch/bmatchSolve.cpp"
                  ,0x77,
                  "bool Bmatch_GetGuess(vector<vector<suppWrap *>> &, vector<vector<suppWrap *>> &, vector<pair<suppWrap *, vector<suppWrap *>>> &, vector<pair<suppWrap *, vector<suppWrap *>>> &, PI_PO_INFO *, METHOD)"
                 );
  }
  local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.first = (suppWrap *)0x0;
  local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_start = (suppWrap **)0x0;
  local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (suppWrap **)0x0;
  local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (suppWrap **)0x0;
  if (method != M_ONE_TO_ONE) {
    bVar13 = 1;
    goto LAB_007be3c0;
  }
  pvVar8 = (f->
           super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar19 = (f->
           super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish != pvVar8;
  uVar10 = (uint)bVar19;
  if (bVar19) {
    local_78 = 0;
    iVar15 = 0;
    lVar18 = 0;
    local_70 = fo;
    local_68 = f;
    local_60 = g;
    do {
      ppsVar17 = pvVar8[lVar18].super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppsVar11 = pvVar8[lVar18].super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (ppsVar17 == ppsVar11) {
        lVar18 = lVar18 + 1;
      }
      else {
        pppsVar14 = &pvVar8[lVar18].super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
        local_7c = iVar15 - 1;
        if (iVar15 == 0) {
          local_7c = 0;
        }
        local_50 = lVar18 + 1;
        local_cc = uVar10;
        local_58 = lVar18 * 3;
        do {
          psVar4 = *ppsVar17;
          ppVar6 = (local_d8->_f_match).
                   super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = (uint)((ulong)((long)(local_d8->_f_match).
                                       super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar6) >>
                        5);
          if (0 < (int)uVar5) {
            uVar9 = (ulong)(uVar5 & 0x7fffffff);
            do {
              if (psVar4 == ppVar6->first) {
                __src = ppsVar17 + 1;
                if (__src != ppsVar11) {
                  memmove(ppsVar17,__src,(long)ppsVar11 - (long)__src);
                  ppsVar11 = *pppsVar14;
                }
                *pppsVar14 = ppsVar11 + -1;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Not GOOD ",9);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
                std::ostream::put(-0x18);
                std::ostream::flush();
                goto LAB_007bdf92;
              }
              ppVar6 = ppVar6 + 1;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
          }
          pvVar8 = (g->
                   super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar5 = (int)((ulong)((long)(g->
                                      super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8) >>
                       3) * -0x55555555;
          if ((int)uVar5 < (int)(uint)local_50) {
            uVar5 = (uint)local_50;
          }
          if (local_7c < uVar5) {
            local_48 = (ulong)uVar5;
            uVar9 = local_78;
            do {
              b = pvVar8[uVar9].super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
              uVar5 = (uint)((ulong)((long)*(pointer *)
                                            ((long)&pvVar8[uVar9].
                                                                                                        
                                                  super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>
                                                  ._M_impl.super__Vector_impl_data + 8) - (long)b)
                            >> 3);
              if (0 < (int)uVar5) {
                uVar16 = (ulong)(uVar5 & 0x7fffffff);
                do {
                  psVar7 = Bmatch_FindSuppWrap(&pInformation->_f_already_try,b);
                  uVar5 = local_cc;
                  if (psVar7 != psVar4) {
                    local_e0 = *b;
                    ppVar6 = (local_d8->_f_already_try).
                             super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    uVar10 = (uint)((ulong)((long)(local_d8->_f_already_try).
                                                  super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)ppVar6) >> 5);
                    if ((int)uVar10 < 1) goto LAB_007be083;
                    lVar18 = 0;
                    goto LAB_007be074;
                  }
                  b = b + 1;
                  uVar16 = uVar16 - 1;
                } while (uVar16 != 0);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 < local_48);
          }
LAB_007bdf92:
          lVar18 = local_58;
          f = local_68;
          pvVar8 = (local_68->
                   super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)
                   ((long)&(pvVar8->super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>).
                           _M_impl.super__Vector_impl_data + local_58 * 8);
          pvVar12 = (void *)puVar1[1];
          __src_00 = (void *)((long)*puVar1 + 8);
          if (__src_00 != pvVar12) {
            memmove((void *)*puVar1,__src_00,(long)pvVar12 - (long)__src_00);
            pvVar12 = (void *)puVar1[1];
            pvVar8 = (f->
                     super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          }
          puVar1[1] = (long)pvVar12 + -8;
          puVar1 = (undefined8 *)
                   ((long)&(pvVar8->super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>).
                           _M_impl.super__Vector_impl_data + lVar18 * 8);
          pppsVar14 = (pointer *)(puVar1 + 1);
          ppsVar17 = (pointer)*puVar1;
          ppsVar11 = *pppsVar14;
          g = local_60;
          lVar18 = local_50;
        } while (ppsVar17 != ppsVar11);
      }
      iVar15 = (int)lVar18;
      local_78 = (ulong)(iVar15 - 1);
      pvVar8 = (f->
               super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar19 = ((long)(f->
                      super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
               -0x5555555555555555 - lVar18 != 0;
      uVar10 = CONCAT31((int3)(uVar10 >> 8),bVar19);
    } while (bVar19);
  }
  uVar5 = 0;
  goto LAB_007be3ae;
  while (lVar18 = lVar18 + 0x20, (ulong)(uVar10 & 0x7fffffff) << 5 != lVar18) {
LAB_007be074:
    if (*(suppWrap **)((long)&ppVar6->first + lVar18) == psVar4) {
      __position._M_current =
           *(suppWrap ***)
            ((long)&(ppVar6->second).super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                    _M_impl + lVar18 + 8);
      if (__position._M_current ==
          *(suppWrap ***)
           ((long)&(ppVar6->second).super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                   _M_impl + lVar18 + 0x10)) {
        std::vector<suppWrap*,std::allocator<suppWrap*>>::_M_realloc_insert<suppWrap*const&>
                  ((vector<suppWrap*,std::allocator<suppWrap*>> *)
                   ((long)&(ppVar6->second).
                           super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl +
                   lVar18),__position,&local_e0);
      }
      else {
        *__position._M_current = local_e0;
        plVar2 = (long *)((long)&(ppVar6->second).
                                 super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl
                         + lVar18 + 8);
        *plVar2 = *plVar2 + 8;
      }
      goto LAB_007be16a;
    }
  }
LAB_007be083:
  if (local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<suppWrap*,std::allocator<suppWrap*>>::_M_realloc_insert<suppWrap*const&>
              ((vector<suppWrap*,std::allocator<suppWrap*>> *)&local_f8,
               (iterator)
               local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_e0);
  }
  else {
    *local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
     super__Vector_impl_data._M_finish = local_e0;
    local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_a8 = psVar4;
  std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::vector(&vStack_a0,&local_f8);
  ppsVar11 = local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ppsVar17 = local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_c8.first = local_a8;
  local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((ppsVar17 != (pointer)0x0) &&
     (operator_delete(ppsVar17,(long)ppsVar11 - (long)ppsVar17),
     vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
  ::push_back(&pInformation->_f_already_try,&local_c8);
  if (local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
LAB_007be16a:
  if (local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<suppWrap*,std::allocator<suppWrap*>>::_M_realloc_insert<suppWrap*const&>
              ((vector<suppWrap*,std::allocator<suppWrap*>> *)&local_f8,
               (iterator)
               local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_e0);
  }
  else {
    *local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
     super__Vector_impl_data._M_finish = local_e0;
    local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_a8 = psVar4;
  std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::vector(&vStack_a0,&local_f8);
  ppsVar11 = local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ppsVar17 = local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_c8.first = local_a8;
  local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((ppsVar17 != (pointer)0x0) &&
     (operator_delete(ppsVar17,(long)ppsVar11 - (long)ppsVar17),
     vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
  ::push_back(local_70,&local_c8);
  if (local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  uVar10 = (uint)((ulong)((long)(local_e0->funSupp).
                                super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(local_e0->funSupp).
                               super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar10) {
    local_d8 = (PI_PO_INFO *)&local_d8->_x_match;
    uVar9 = 0;
    do {
      ppsVar17 = local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      local_38 = Bmatch_FindSuppWrap((vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                                      *)local_d8,
                                     (local_e0->funSupp).
                                     super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start + uVar9);
      if (local_38 == (suppWrap *)0x0) {
        uVar5 = (uint)((ulong)((long)(psVar4->funSupp).
                                     super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(psVar4->funSupp).
                                    super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 3);
        if (0 < (int)uVar5) {
          uVar16 = (ulong)(uVar5 & 0x7fffffff);
          lVar18 = 0;
          do {
            ppsVar17 = (psVar4->funSupp).super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            psVar7 = *(suppWrap **)((long)ppsVar17 + lVar18);
            iVar15 = psVar7->numOfInfluence;
            iVar3 = (local_e0->funSupp).super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar9]->numOfInfluence;
            if ((iVar3 + -1 <= iVar15) && (iVar15 <= iVar3 + 1)) {
              if (local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<suppWrap*,std::allocator<suppWrap*>>::_M_realloc_insert<suppWrap*const&>
                          ((vector<suppWrap*,std::allocator<suppWrap*>> *)&local_f8,
                           (iterator)
                           local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish,
                           (suppWrap **)((long)ppsVar17 + lVar18));
              }
              else {
                *local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                 super__Vector_impl_data._M_finish = psVar7;
                local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            lVar18 = lVar18 + 8;
            uVar16 = uVar16 - 1;
          } while (uVar16 != 0);
        }
      }
      else if (ppsVar17 ==
               local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
        std::vector<suppWrap*,std::allocator<suppWrap*>>::_M_realloc_insert<suppWrap*const&>
                  ((vector<suppWrap*,std::allocator<suppWrap*>> *)&local_f8,(iterator)ppsVar17,
                   &local_38);
      }
      else {
        *ppsVar17 = local_38;
        local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_a8 = (local_e0->funSupp).super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar9];
      std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::vector(&vStack_a0,&local_f8);
      ppsVar11 = local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
      ppsVar17 = local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      local_c8.first = local_a8;
      local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((ppsVar17 != (pointer)0x0) &&
         (operator_delete(ppsVar17,(long)ppsVar11 - (long)ppsVar17),
         vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
         super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_a0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
      ::push_back(local_40,&local_c8);
      if (local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      uVar9 = uVar9 + 1;
      uVar5 = local_cc;
    } while (uVar9 != (uVar10 & 0x7fffffff));
  }
LAB_007be3ae:
  bVar13 = (byte)uVar5;
  if (local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_start != (suppWrap **)0x0) {
    operator_delete(local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_007be3c0:
  if (local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.second.
                          super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.second.
                          super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (bool)(bVar13 & 1);
}

Assistant:

bool Bmatch_GetGuess ( vector< vector< suppWrap * > > & f,
					   vector< vector< suppWrap * > > & g,
					   vector< pair< suppWrap *, vector< suppWrap * > > > & fo,
					   vector< pair< suppWrap *, vector< suppWrap * > > > & gi,
					   PI_PO_INFO * pInformation,
					   METHOD method )
{
	assert( !f.empty() && !g.empty() );
	pair< suppWrap *, vector< suppWrap * > > tmpPair;
	vector< suppWrap * > mapNodes;
	suppWrap * tmpWrap1, * tmpWrap2, * tmpW;
	int piCap = 3, poCap = 1, currentIndex = 0;
	bool done = false, findPair = false, save = false, notGood = false;

    //int capacity = ( Abc_NtkPoNum( tmpInformation->_cir1 ) - Abc_NtkPoNum( tmpInformation->_cir2 ) );
    //capacity = (capacity >= 0) ? capacity + 1 : 1;

	switch( method ) {
		case M_ONE_TO_ONE:
            while( !findPair ) {
                if( currentIndex == f.size() ) return false;
                else { 
                    while( !f[currentIndex].empty() ){
                        tmpWrap2 = f[currentIndex][0];
                        for( int i = 0, n = pInformation->_f_match.size(); i < n; ++i ) {
                            if( tmpWrap2 == pInformation->_f_match[i].first ) {
                                f[currentIndex].erase(f[currentIndex].begin());
                    cout << "Not GOOD " << endl;
                                notGood = true;
                                break;
                            }
                        }
                        if( !notGood ) {
                        for( int i = (currentIndex >= poCap) ? currentIndex - poCap : 0,
                                 n = max((int)g.size(), currentIndex + poCap); i < n; ++i ) {
                            for( int j = 0, m = g[i].size(); j < m; ++j ) {
                                if( !(Bmatch_FindSuppWrap( pInformation->_f_already_try, g[i][j] ) == tmpWrap2) ) {
                                    tmpWrap1 = g[i][j];

                                    for( int k = 0, l = pInformation->_f_already_try.size(); k < l; ++k ) {
                                        if( pInformation->_f_already_try[k].first == tmpWrap2 ) {
                                            pInformation->_f_already_try[k].second.push_back(tmpWrap1);
                                            save = true;
                                            break;
                                        }
                                    }
                                    if( !save ) {
                                        mapNodes.push_back(tmpWrap1);
                                        tmpPair = make_pair(tmpWrap2, mapNodes);
                                        pInformation->_f_already_try.push_back(tmpPair);
                                        mapNodes.clear();
                                    }
                                    save = false;
                                    findPair = true;
                                    break;
                                }
                            }
                            if( findPair ) break;
                        }
                        }
                        notGood = false;
                        if( !findPair ) {
                            f[currentIndex].erase(f[currentIndex].begin());
                        }
                        else break;
                    }
                }
                ++currentIndex;
            }
            //
			// tmpWrap1 = g[0][0]; tmpWrap2 = f[0][0];
			mapNodes.push_back( tmpWrap1 );
			tmpPair = make_pair( tmpWrap2, mapNodes );
			fo.push_back(tmpPair);

			mapNodes.clear();
			for( int i = 0, n = tmpWrap1->funSupp.size(); i < n; ++i ) {
				tmpW = Bmatch_FindSuppWrap( pInformation->_x_match, tmpWrap1->funSupp[i] );
				if( tmpW != NULL ) {
					mapNodes.push_back( tmpW );
					done = true;
				}
				if( !done ) {
					for( int j = 0, m = tmpWrap2->funSupp.size(); j < m; ++j ) {
						if( tmpWrap2->funSupp[j]->numOfInfluence >= tmpWrap1->funSupp[i]->numOfInfluence - poCap &&
							tmpWrap2->funSupp[j]->numOfInfluence <= tmpWrap1->funSupp[i]->numOfInfluence + poCap ) {
							mapNodes.push_back( tmpWrap2->funSupp[j] );
						}
					}
				}
				tmpPair = make_pair( tmpWrap1->funSupp[i], mapNodes );
				gi.push_back(tmpPair);
				mapNodes.clear();
				done = false;
			}
            //
		break;
		default:
		break;
	}
    return true;
}